

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

void __thiscall duckdb::JoinHashTable::InsertState::InsertState(InsertState *this,JoinHashTable *ht)

{
  pointer pTVar1;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  SharedState::SharedState(&this->super_SharedState);
  SelectionVector::SelectionVector(&this->remaining_sel,0x800);
  SelectionVector::SelectionVector(&this->key_match_sel,0x800);
  DataChunk::DataChunk(&this->lhs_data);
  TupleDataChunkState::TupleDataChunkState(&this->chunk_state);
  pTVar1 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
           ::operator->(&ht->data_collection);
  TupleDataCollection::InitializeChunk(pTVar1,&this->lhs_data,&ht->equality_predicate_columns);
  pTVar1 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
           ::operator->(&ht->data_collection);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40,
             &(ht->equality_predicate_columns).
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  TupleDataCollection::InitializeChunkState
            (pTVar1,&this->chunk_state,(vector<unsigned_long,_true> *)&local_40);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

JoinHashTable::InsertState::InsertState(const JoinHashTable &ht)
    : SharedState(), remaining_sel(STANDARD_VECTOR_SIZE), key_match_sel(STANDARD_VECTOR_SIZE) {
	ht.data_collection->InitializeChunk(lhs_data, ht.equality_predicate_columns);
	ht.data_collection->InitializeChunkState(chunk_state, ht.equality_predicate_columns);
}